

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

ostream * __thiscall smf::Options::printRegister(Options *this,ostream *out)

{
  bool bVar1;
  reference ppOVar2;
  Option_register **item;
  iterator __end1;
  iterator __begin1;
  vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_> *__range1;
  ostream *out_local;
  Options *this_local;
  
  __end1 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::begin
                     (&this->m_optionRegister);
  item = (Option_register **)
         std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::end
                   (&this->m_optionRegister);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<smf::Option_register_**,_std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>_>
                                *)&item);
    if (!bVar1) break;
    ppOVar2 = __gnu_cxx::
              __normal_iterator<smf::Option_register_**,_std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>_>
              ::operator*(&__end1);
    Option_register::print(*ppOVar2,out);
    __gnu_cxx::
    __normal_iterator<smf::Option_register_**,_std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>_>
    ::operator++(&__end1);
  }
  return out;
}

Assistant:

std::ostream& Options::printRegister(std::ostream& out) {
	for (auto &item : m_optionRegister) {
		item->print(out);
	}
	return out;
}